

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_bfffo_32_al(void)

{
  uint uVar1;
  uint uVar2;
  sbyte sVar3;
  byte bVar4;
  uint uVar5;
  uint address;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    uVar1 = m68ki_read_imm_16();
    uVar2 = m68ki_read_imm_32();
    if ((uVar1 >> 0xb & 1) == 0) {
      uVar6 = uVar1 >> 6 & 0x1f;
    }
    else {
      uVar6 = m68ki_cpu.dar[uVar1 >> 6 & 7];
    }
    uVar7 = uVar1;
    if ((uVar1 & 0x20) != 0) {
      uVar7 = m68ki_cpu.dar[uVar1 & 7];
    }
    address = (int)uVar6 / 8 + uVar2 + -1 + (uint)((uVar6 & 0x80000007) < 0x80000001);
    uVar8 = uVar7 - 1 & 0x1f;
    uVar2 = m68ki_read_32_fc(address,m68ki_address_space | m68ki_cpu.s_flag);
    sVar3 = (sbyte)(uVar6 & 7);
    uVar5 = uVar2 << sVar3;
    if (0x20 < uVar8 + (uVar6 & 7) + 1) {
      uVar2 = m68ki_read_8_fc(address + 4,m68ki_address_space | m68ki_cpu.s_flag);
      uVar5 = uVar5 | (uVar2 << sVar3) >> 8;
    }
    m68ki_cpu.n_flag = uVar5 >> 0x18;
    bVar4 = (byte)uVar8;
    m68ki_cpu.not_z_flag = uVar5 >> (~bVar4 & 0x1f);
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    for (uVar5 = 1 << bVar4; (uVar5 != 0 && ((uVar5 & m68ki_cpu.not_z_flag) == 0));
        uVar5 = uVar5 >> 1) {
      uVar6 = uVar6 + 1;
    }
    *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x1c)) = uVar6;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_bfffo_32_al(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		sint local_offset;
		uint width = word2;
		uint data;
		uint bit;
		uint ea = EA_AL_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		local_offset = offset % 8;
		if(local_offset < 0)
		{
			local_offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;

		data = m68ki_read_32(ea);
		data = MASK_OUT_ABOVE_32(data<<local_offset);

		if((local_offset+width) > 32)
			data |= (m68ki_read_8(ea+4) << local_offset) >> 8;

		FLAG_N = NFLAG_32(data);
		data  >>= (32 - width);

		FLAG_Z = data;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		for(bit = 1<<(width-1);bit && !(data & bit);bit>>= 1)
			offset++;

		REG_D[(word2>>12)&7] = offset;

		return;
	}
	m68ki_exception_illegal();
}